

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QList<unsigned_int> *
qt_convert_to_ucs4(QList<unsigned_int> *__return_storage_ptr__,QStringView string)

{
  long lVar1;
  uint *puVar2;
  uint *puVar3;
  long in_FS_OFFSET;
  uint *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  QList<unsigned_int>::QList(__return_storage_ptr__,string.m_size);
  puVar2 = (__return_storage_ptr__->d).ptr;
  puVar3 = puVar2;
  if (0 < string.m_size) {
    qt_convert_to_ucs4();
    puVar3 = local_30;
  }
  QList<unsigned_int>::resize(__return_storage_ptr__,(long)puVar3 - (long)puVar2 >> 2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<uint> qt_convert_to_ucs4(QStringView string)
{
    QList<uint> v(string.size());
    uint *a = const_cast<uint*>(v.constData());
    QStringIterator it(string);
    while (it.hasNext())
        *a++ = it.next();
    v.resize(a - v.constData());
    return v;
}